

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O1

decimal128_to_chars_result
jsoncons::bson::decimal128_to_chars(char *first,char *last,decimal128_t *dec)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 auVar3 [16];
  int iVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  undefined1 *puVar16;
  uint uVar17;
  _Alloc_hider _Var18;
  long lVar19;
  int *__s;
  char *pcVar20;
  char *pcVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  decimal128_to_chars_result dVar24;
  string bson_decimal128_nan;
  string s;
  string bson_decimal128_inf;
  uint32_t significand [36];
  long *local_128;
  size_t local_120;
  long local_118 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  long *local_e8;
  size_t local_e0;
  long local_d8 [2];
  int local_c8;
  int local_c4 [34];
  undefined1 local_3c [12];
  
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Infinity","");
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"NaN","");
  __s = &local_c8;
  memset(__s,0,0x90);
  pcVar20 = first;
  if ((long)dec->high < 0) {
    pcVar20 = first + 1;
    *first = '-';
  }
  uVar10 = dec->low;
  uVar11 = dec->high;
  uVar17 = (uint)(uVar11 >> 0x20);
  if ((~uVar17 & 0x60000000) == 0) {
    uVar13 = uVar17 >> 0x1a & 0x1f;
    if (uVar13 == 0x1f) {
      pcVar20 = first;
      if ((long)local_120 <= (long)last - (long)first) {
        memcpy(first,local_128,local_120);
        pcVar20 = first + local_120;
      }
      *pcVar20 = '\0';
      uVar12 = 0;
      goto LAB_0020b4ba;
    }
    if (uVar13 == 0x1e) {
      if ((long)local_e0 <= (long)last - (long)pcVar20) {
        memcpy(pcVar20,local_e8,local_e0);
        pcVar20 = pcVar20 + local_e0;
      }
      *pcVar20 = '\0';
      uVar12 = 0;
      goto LAB_0020b4ba;
    }
    uVar13 = uVar17 >> 0xf;
    uVar14 = uVar17 >> 0xe & 1 | 8;
  }
  else {
    uVar14 = uVar17 >> 0xe & 7;
    uVar13 = uVar17 >> 0x11;
  }
  uVar13 = uVar13 & 0x3fff;
  uVar17 = uVar14 << 0xe | uVar17 & 0x3fff;
  if ((uVar14 < 8) &&
     ((int)uVar10 != 0 || (((int)(uVar10 >> 0x20) != 0 || (int)uVar11 != 0) || uVar17 != 0))) {
    lVar15 = 3;
    puVar16 = local_3c;
    local_108._M_string_length = uVar10 << 0x20 | uVar10 >> 0x20;
    _Var18._M_p = (pointer)(ulong)uVar17;
    do {
      local_108._M_dataplus._M_p = (pointer)((ulong)_Var18._M_p & 0xffffffff | uVar11 << 0x20);
      _Var5._M_p = local_108._M_dataplus._M_p;
      sVar6 = local_108._M_string_length;
      local_108._M_dataplus._M_p._0_4_ = (int)_Var18._M_p;
      local_108._M_dataplus._M_p._4_4_ = (int)uVar11;
      local_108._M_string_length._4_4_ = (int)(local_108._M_string_length >> 0x20);
      auVar23._0_4_ = -(uint)((int)local_108._M_dataplus._M_p == 0);
      auVar23._4_4_ = -(uint)(local_108._M_dataplus._M_p._4_4_ == 0);
      auVar23._8_4_ = -(uint)((int)local_108._M_string_length == 0);
      auVar23._12_4_ = -(uint)(local_108._M_string_length._4_4_ == 0);
      iVar7 = movmskps(0,auVar23);
      local_108._M_string_length = sVar6;
      local_108._M_dataplus._M_p = _Var5._M_p;
      if (iVar7 == 0xf) {
        uVar10 = 0;
      }
      else {
        lVar19 = 0;
        uVar10 = 0;
        do {
          uVar10 = uVar10 << 0x20 | (ulong)*(uint *)((long)&local_108._M_dataplus._M_p + lVar19 * 4)
          ;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar10;
          uVar11 = SUB168(auVar3 * ZEXT816(0x112e0be826d694b3),8) >> 0x1a;
          *(int *)((long)&local_108._M_dataplus._M_p + lVar19 * 4) = (int)uVar11;
          uVar10 = uVar10 + uVar11 * -1000000000;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 4);
      }
      if ((int)uVar10 != 0) {
        lVar19 = 0;
        do {
          iVar7 = (int)uVar10;
          uVar11 = uVar10 & 0xffffffff;
          uVar10 = uVar11 / 10;
          *(int *)(puVar16 + lVar19 * 4) = iVar7 + (int)(uVar11 / 10) * -10;
          lVar19 = lVar19 + -1;
        } while (lVar19 != -9);
      }
      uVar11 = (ulong)local_108._M_dataplus._M_p >> 0x20;
      puVar16 = puVar16 + -0x24;
      bVar22 = lVar15 != 0;
      lVar15 = lVar15 + -1;
      _Var18._M_p = local_108._M_dataplus._M_p;
    } while (bVar22);
    uVar17 = 0x24;
    if (local_c8 == 0) {
      uVar17 = 0x24;
      piVar9 = &local_c8;
      do {
        uVar17 = uVar17 - 1;
        __s = piVar9 + 1;
        piVar1 = piVar9 + 1;
        piVar9 = __s;
      } while (*piVar1 == 0);
    }
  }
  else {
    local_c8 = 0;
    uVar17 = 1;
  }
  iVar7 = uVar17 + (uVar13 - 0x1820) + -1;
  if ((uVar13 < 0x1821) && (-7 < iVar7)) {
    if (uVar13 < 0x1820) {
      iVar7 = (uVar13 - 0x1820) + uVar17;
      if (iVar7 < 1) {
        *pcVar20 = '0';
        pcVar21 = pcVar20 + 1;
      }
      else {
        pcVar21 = pcVar20;
        if (pcVar20 < last) {
          iVar8 = 1;
          do {
            iVar4 = *__s;
            __s = __s + 1;
            *pcVar21 = (char)iVar4 + '0';
            pcVar21 = pcVar21 + 1;
            if (iVar7 <= iVar8) break;
            iVar8 = iVar8 + 1;
          } while (pcVar21 < last);
        }
      }
      *pcVar21 = '.';
      pcVar20 = pcVar21 + 1;
      if (iVar7 < 0) {
        uVar10 = (ulong)(0x181f - (uVar13 + uVar17));
        memset(pcVar20,0x30,uVar10 + 1);
        pcVar20 = pcVar21 + uVar10 + 2;
        iVar7 = 0;
      }
      if ((uVar17 - iVar7 != 0) && (pcVar20 < last)) {
        uVar10 = 1;
        do {
          uVar11 = uVar10;
          pcVar20[uVar11 - 1] = (char)__s[uVar11 - 1] + '0';
          if (uVar17 - iVar7 <= uVar11) break;
          uVar10 = uVar11 + 1;
        } while (pcVar20 + uVar11 < last);
        pcVar20 = pcVar20 + uVar11;
      }
    }
    else if ((long)pcVar20 - (long)first < 0x24 && uVar17 != 0) {
      uVar10 = 0;
      do {
        pcVar20[uVar10] = (char)__s[uVar10] + '0';
        uVar11 = uVar10 + 1;
        if (uVar17 <= uVar11) break;
        lVar15 = uVar10 + ((long)pcVar20 - (long)first) + 1;
        uVar10 = uVar11;
      } while (lVar15 < 0x24);
      pcVar20 = pcVar20 + uVar11;
      uVar12 = 0;
      goto LAB_0020b4ba;
    }
    uVar12 = 0;
  }
  else {
    *pcVar20 = (char)*__s + '0';
    if (uVar17 - 1 == 0) {
      pcVar20 = pcVar20 + 1;
    }
    else {
      pcVar20[1] = '.';
      pcVar20 = pcVar20 + 2;
      if ((long)pcVar20 - (long)first < 0x24) {
        uVar10 = 0;
        do {
          pcVar20[uVar10] = (char)__s[uVar10 + 1] + '0';
          uVar11 = uVar10 + 1;
          if (uVar17 - 1 <= uVar11) break;
          lVar15 = uVar10 + ((long)pcVar20 - (long)first) + 1;
          uVar10 = uVar11;
        } while (lVar15 < 0x24);
        pcVar20 = pcVar20 + uVar11;
      }
    }
    *pcVar20 = 'E';
    paVar2 = &local_108.field_2;
    local_108._M_string_length = 0;
    local_108.field_2._M_local_buf[0] = '\0';
    local_108._M_dataplus._M_p = (pointer)paVar2;
    if (-1 < iVar7) {
      std::__cxx11::string::push_back((char)&local_108);
    }
    jsoncons::detail::from_integer<int,std::__cxx11::string>(iVar7,&local_108);
    pcVar20 = pcVar20 + 1;
    pcVar21 = pcVar20 + local_108._M_string_length;
    if (pcVar21 < last) {
      memcpy(pcVar20,local_108._M_dataplus._M_p,local_108._M_string_length);
      pcVar20 = pcVar20 + local_108._M_string_length;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    uVar12 = 0x4b;
    if (pcVar21 < last) {
      uVar12 = 0;
    }
  }
LAB_0020b4ba:
  if (local_128 != local_118) {
    operator_delete(local_128,local_118[0] + 1);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  dVar24.ec = uVar12;
  dVar24.ptr = pcVar20;
  dVar24._12_4_ = 0;
  return dVar24;
}

Assistant:

inline
    decimal128_to_chars_result decimal128_to_chars(char* first, char* last, const decimal128_t& dec)
    {
        const std::string bson_decimal128_inf = "Infinity";
        const std::string bson_decimal128_nan = "NaN";

        const uint32_t combination_mask = 0x1f;   /* Extract least significant 5 bits */
        const uint32_t exponent_mask = 0x3fff;    /* Extract least significant 14 bits */
        const uint32_t combination_infinity = 30; /* Value of combination field for Inf */
        const uint32_t combination_nan = 31;      /* Value of combination field for NaN */
        const uint32_t exponent_bias = 6176;      /* decimal128 exponent bias */

        char* str_out = first;      /* output pointer in string */
        char significand_str[35]; /* decoded significand digits */

        /* Note: bits in this routine are referred to starting at 0, */
        /* from the sign bit, towards the coefficient. */
        uint32_t high;                   /* bits 0 - 31 */
        uint32_t midh;                   /* bits 32 - 63 */
        uint32_t midl;                   /* bits 64 - 95 */
        uint32_t low;                    /* bits 96 - 127 */
        uint32_t combination;            /* bits 1 - 5 */
        uint32_t biased_exponent;        /* decoded biased exponent (14 bits) */
        uint32_t significand_digits = 0; /* the number of significand digits */
        uint32_t significand[36] = {0};  /* the base-10 digits in the significand */
        uint32_t *significand_read = significand; /* read pointer into significand */
        int32_t exponent;                         /* unbiased exponent */
        int32_t scientific_exponent; /* the exponent if scientific notation is
                                      * used */
        bool is_zero = false;        /* true if the number is zero */
 
        uint8_t significand_msb; /* the most signifcant significand bits (50-46) */
        bson_uint128_t
           significand128; /* temporary storage for significand decoding */
 
        memset (significand_str, 0, sizeof (significand_str));
 
        if ((int64_t) dec.high < 0) { /* negative */
           *(str_out++) = '-';
        }
 
        low = (uint32_t) dec.low, midl = (uint32_t) (dec.low >> 32),
        midh = (uint32_t) dec.high, high = (uint32_t) (dec.high >> 32);
 
        /* Decode combination field and exponent */
        combination = (high >> 26) & combination_mask;
 
        if (JSONCONS_UNLIKELY ((combination >> 3) == 3)) {
           /* Check for 'special' values */
           if (combination == combination_infinity) { /* Infinity */
               if (last-str_out >= static_cast<ptrdiff_t >(bson_decimal128_inf.size())) 
               {
                   std::memcpy(str_out, bson_decimal128_inf.data(), bson_decimal128_inf.size());
                   str_out += bson_decimal128_inf.size();
               }
               *str_out = 0;
              //strcpy_s (str_out, last-str_out, bson_decimal128_inf.c_str());
              return decimal128_to_chars_result{str_out, std::errc()};
           } else if (combination == combination_nan) { /* NaN */
               /* first, not str_out, to erase the sign */
               str_out = first;
               if (last-str_out >= static_cast<ptrdiff_t >(bson_decimal128_nan.size())) 
               {
                   std::memcpy(str_out, bson_decimal128_nan.data(), bson_decimal128_nan.size());
                   str_out += bson_decimal128_nan.size();
               }
               *str_out = 0;
              //strcpy_s (first, last-first, bson_decimal128_nan.c_str());
              /* we don't care about the NaN payload. */
               return decimal128_to_chars_result{str_out, std::errc()};
           } else {
              biased_exponent = (high >> 15) & exponent_mask;
              significand_msb = 0x8 + ((high >> 14) & 0x1);
           }
        } else {
           significand_msb = (high >> 14) & 0x7;
           biased_exponent = (high >> 17) & exponent_mask;
        }
 
        exponent = biased_exponent - exponent_bias;
        /* Create string of significand digits */
 
        /* Convert the 114-bit binary number represented by */
        /* (high, midh, midl, low) to at most 34 decimal */
        /* digits through modulo and division. */
        significand128.parts[0] = (high & 0x3fff) + ((significand_msb & 0xf) << 14);
        significand128.parts[1] = midh;
        significand128.parts[2] = midl;
        significand128.parts[3] = low;
 
        if (significand128.parts[0] == 0 && significand128.parts[1] == 0 &&
            significand128.parts[2] == 0 && significand128.parts[3] == 0) {
           is_zero = true;
        } else if (significand128.parts[0] >= (1 << 17)) {
           /* The significand is non-canonical or zero.
            * In order to preserve compatibility with the densely packed decimal
            * format, the maximum value for the significand of decimal128 is
            * 1e34 - 1.  If the value is greater than 1e34 - 1, the IEEE 754
            * standard dictates that the significand is interpreted as zero.
            */
           is_zero = true;
        } else {
           for (int k = 3; k >= 0; k--) {
              uint32_t least_digits = 0;
              detail::bson_uint128_divide1B (
                 significand128, &significand128, &least_digits);
 
              /* We now have the 9 least significant digits (in base 2). */
              /* Convert and output to string. */
              if (!least_digits) {
                 continue;
              }
 
              for (int j = 8; j >= 0; j--) {
                 significand[k * 9 + j] = least_digits % 10;
                 least_digits /= 10;
              }
           }
        }
 
        /* Output format options: */
        /* Scientific - [-]d.dddE(+/-)dd or [-]dE(+/-)dd */
        /* Regular    - ddd.ddd */
 
        if (is_zero) {
           significand_digits = 1;
           *significand_read = 0;
        } else {
           significand_digits = 36;
           while (!(*significand_read)) {
              significand_digits--;
              significand_read++;
           }
        }
 
        scientific_exponent = significand_digits - 1 + exponent;
 
        /* The scientific exponent checks are dictated by the string conversion
         * specification and are somewhat arbitrary cutoffs.
         *
         * We must check exponent > 0, because if this is the case, the number
         * has trailing zeros.  However, we *cannot* output these trailing zeros,
         * because doing so would change the precision of the value, and would
         * change stored data if the string converted number is round tripped.
         */
        if (scientific_exponent < -6 || exponent > 0) {
           /* Scientific format */
           *(str_out++) = char(*(significand_read++)) + '0';
           significand_digits--;
 
           if (significand_digits) {
              *(str_out++) = '.';
           }
 
           for (std::size_t i = 0; i < significand_digits && (str_out - first) < 36; i++) {
              *(str_out++) = char(*(significand_read++)) + '0';
           }
           /* Exponent */
           *(str_out++) = 'E';

           std::string s;
           if (scientific_exponent >= 0) {
               s.push_back('+');
           }
           jsoncons::detail::from_integer(scientific_exponent, s);
           if (str_out + s.size() < last) 
           {
               std::memcpy(str_out, s.data(), s.size());
           }
           else
           {
               return decimal128_to_chars_result{str_out, std::errc::value_too_large};
           }
           str_out += s.size();
        } else {
           /* Regular format with no decimal place */
           if (exponent >= 0) {
              for (std::size_t i = 0; i < significand_digits && (str_out - first) < 36; i++) {
                 *(str_out++) = char(*(significand_read++)) + '0';
              }
           } else {
              int32_t radix_position = significand_digits + exponent;
 
              if (radix_position > 0) { /* non-zero digits before radix */
                 for (int32_t i = 0;
                      i < radix_position && (str_out < last);
                      i++) {
                    *(str_out++) = char(*(significand_read++)) + '0';
                 }
              } else { /* leading zero before radix point */
                 *(str_out++) = '0';
              }
 
              *(str_out++) = '.';
              while (radix_position++ < 0) { /* add leading zeros after radix */
                 *(str_out++) = '0';
              }
 
              for (std::size_t i = 0;
                   (i < significand_digits - (std::max) (radix_position - 1, 0)) &&
                   (str_out < last);
                   i++) {
                 *(str_out++) = char(*(significand_read++)) + '0';
              }
           }
        }
        return decimal128_to_chars_result{str_out, std::errc()};
    }